

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void constructor(LexState *ls,expdesc *t)

{
  uint uVar1;
  FuncState *fs;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ConsControl cc;
  
  fs = ls->fs;
  iVar4 = ls->linenumber;
  iVar2 = luaK_codeABC(fs,OP_NEWTABLE,0,0,0);
  cc.tostore = 0;
  cc.nh = 0;
  cc.na = 0;
  t->t = -1;
  t->f = -1;
  t->k = VRELOCABLE;
  (t->u).info = iVar2;
  cc.v.t = -1;
  cc.v.f = -1;
  cc.v.k = VVOID;
  cc.v.u.info = 0;
  cc.t = t;
  luaK_exp2nextreg(ls->fs,t);
  checknext(ls,0x7b);
  do {
    do {
      iVar3 = (ls->t).token;
      if (iVar3 == 0x7d) goto LAB_00113292;
      if (cc.v.k != VVOID) {
        luaK_exp2nextreg(fs,&cc.v);
        cc.v.k = VVOID;
        if (cc.tostore == 0x32) {
          luaK_setlist(fs,((cc.t)->u).info,cc.na,0x32);
          cc.tostore = 0;
        }
        iVar3 = (ls->t).token;
      }
      if (iVar3 == 0x5b) {
LAB_00113254:
        recfield(ls,&cc);
      }
      else {
        if (iVar3 == 0x124) {
          iVar3 = luaX_lookahead(ls);
          if (iVar3 == 0x3d) goto LAB_00113254;
        }
        listfield(ls,&cc);
      }
      iVar3 = testnext(ls,0x2c);
    } while (iVar3 != 0);
    iVar3 = testnext(ls,0x3b);
  } while (iVar3 != 0);
LAB_00113292:
  check_match(ls,0x7d,0x7b,iVar4);
  if (cc.tostore != 0) {
    if (cc.v.k - VCALL < 2) {
      luaK_setreturns(fs,&cc.v,-1);
      luaK_setlist(fs,((cc.t)->u).info,cc.na,-1);
      cc.na = cc.na + -1;
    }
    else {
      if (cc.v.k != VVOID) {
        luaK_exp2nextreg(fs,&cc.v);
      }
      luaK_setlist(fs,((cc.t)->u).info,cc.na,cc.tostore);
    }
  }
  uVar1 = fs->f->code[iVar2];
  iVar4 = luaO_int2fb(cc.na);
  fs->f->code[iVar2] = iVar4 << 0x17 | uVar1 & 0x7fffff;
  uVar5 = luaO_int2fb(cc.nh);
  fs->f->code[iVar2] = (uVar5 & 0x1ff) << 0xe | iVar4 << 0x17 | uVar1 & 0x3fff;
  return;
}

Assistant:

static void constructor(LexState *ls, expdesc *t) {
    /* constructor -> '{' [ field { sep field } [sep] ] '}'
       sep -> ',' | ';' */
    FuncState *fs = ls->fs;
    int line = ls->linenumber;
    int pc = luaK_codeABC(fs, OP_NEWTABLE, 0, 0, 0);
    struct ConsControl cc;
    cc.na = cc.nh = cc.tostore = 0;
    cc.t = t;
    init_exp(t, VRELOCABLE, pc);
    init_exp(&cc.v, VVOID, 0);  /* no value (yet) */
    luaK_exp2nextreg(ls->fs, t);  /* fix it at stack top */
    checknext(ls, '{');
    do {
        lua_assert(cc.v.k == VVOID || cc.tostore > 0);
        if (ls->t.token == '}') break;
        closelistfield(fs, &cc);
        field(ls, &cc);
    } while (testnext(ls, ',') || testnext(ls, ';'));
    check_match(ls, '}', '{', line);
    lastlistfield(fs, &cc);
    SETARG_B(fs->f->code[pc], luaO_int2fb(cc.na)); /* set initial array size */
    SETARG_C(fs->f->code[pc], luaO_int2fb(cc.nh));  /* set initial table size */
}